

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QToolBarAreaLayoutLine>::reallocateAndGrow
          (QArrayDataPointer<QToolBarAreaLayoutLine> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QToolBarAreaLayoutLine> *old)

{
  QToolBarAreaLayoutLine *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  QToolBarAreaLayoutItem *pQVar4;
  Data *pDVar5;
  bool bVar6;
  Representation RVar7;
  Representation RVar8;
  Representation RVar9;
  QToolBarAreaLayoutLine *pQVar10;
  QToolBarAreaLayoutLine *pQVar11;
  qsizetype qVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QArrayDataPointer<QToolBarAreaLayoutLine> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar12 = 0;
        lVar13 = 0;
      }
      else {
        qVar12 = pQVar2->alloc;
        lVar13 = (this->size - pQVar2->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                 -0x5555555555555555;
      }
      auVar14 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x30,qVar12 + n + lVar13,Grow);
      this->d = (Data *)auVar14._0_8_;
      this->ptr = (QToolBarAreaLayoutLine *)auVar14._8_8_;
      goto LAB_004bbb30;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QToolBarAreaLayoutLine *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar13 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar10 = this->ptr;
    pQVar11 = pQVar10 + lVar13;
    if ((old != (QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0) || (bVar6)) {
      if ((lVar13 != 0) && (0 < lVar13)) {
        do {
          local_38.ptr[local_38.size].o = pQVar10->o;
          RVar7.m_i = (pQVar10->rect).y1.m_i;
          RVar8.m_i = (pQVar10->rect).x2.m_i;
          RVar9.m_i = (pQVar10->rect).y2.m_i;
          pQVar1 = local_38.ptr + local_38.size;
          (pQVar1->rect).x1 = (Representation)(pQVar10->rect).x1.m_i;
          (pQVar1->rect).y1 = (Representation)RVar7.m_i;
          (pQVar1->rect).x2 = (Representation)RVar8.m_i;
          (pQVar1->rect).y2 = (Representation)RVar9.m_i;
          pDVar3 = (pQVar10->toolBarItems).d.d;
          local_38.ptr[local_38.size].toolBarItems.d.d = pDVar3;
          local_38.ptr[local_38.size].toolBarItems.d.ptr = (pQVar10->toolBarItems).d.ptr;
          local_38.ptr[local_38.size].toolBarItems.d.size = (pQVar10->toolBarItems).d.size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar10 = pQVar10 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar10 < pQVar11);
      }
    }
    else if ((lVar13 != 0) && (0 < lVar13)) {
      do {
        local_38.ptr[local_38.size].o = pQVar10->o;
        RVar7.m_i = (pQVar10->rect).y1.m_i;
        RVar8.m_i = (pQVar10->rect).x2.m_i;
        RVar9.m_i = (pQVar10->rect).y2.m_i;
        pQVar1 = local_38.ptr + local_38.size;
        (pQVar1->rect).x1 = (Representation)(pQVar10->rect).x1.m_i;
        (pQVar1->rect).y1 = (Representation)RVar7.m_i;
        (pQVar1->rect).x2 = (Representation)RVar8.m_i;
        (pQVar1->rect).y2 = (Representation)RVar9.m_i;
        pDVar3 = (pQVar10->toolBarItems).d.d;
        (pQVar10->toolBarItems).d.d = (Data *)0x0;
        local_38.ptr[local_38.size].toolBarItems.d.d = pDVar3;
        pQVar4 = (pQVar10->toolBarItems).d.ptr;
        (pQVar10->toolBarItems).d.ptr = (QToolBarAreaLayoutItem *)0x0;
        local_38.ptr[local_38.size].toolBarItems.d.ptr = pQVar4;
        qVar12 = (pQVar10->toolBarItems).d.size;
        (pQVar10->toolBarItems).d.size = 0;
        local_38.ptr[local_38.size].toolBarItems.d.size = qVar12;
        pQVar10 = pQVar10 + 1;
        local_38.size = local_38.size + 1;
      } while (pQVar10 < pQVar11);
    }
  }
  pDVar5 = this->d;
  pQVar10 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar12 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar5;
  local_38.ptr = pQVar10;
  local_38.size = qVar12;
  if (old != (QArrayDataPointer<QToolBarAreaLayoutLine> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar5;
    old->ptr = pQVar10;
    local_38.size = old->size;
    old->size = qVar12;
  }
  ~QArrayDataPointer(&local_38);
LAB_004bbb30:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }